

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exposer.cc
# Opt level: O1

void __thiscall
prometheus::Exposer::Exposer
          (Exposer *this,string *bind_address,size_t num_threads,CivetCallbacks *callbacks)

{
  pointer pcVar1;
  bool bVar2;
  char cVar3;
  size_t sVar4;
  string *__str;
  char cVar5;
  long lVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_d1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  CivetCallbacks *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  char *local_50;
  uint local_48;
  char local_40 [16];
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"listening_ports","");
  local_90[0] = local_80;
  pcVar1 = (bind_address->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,pcVar1,pcVar1 + bind_address->_M_string_length);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"num_threads","");
  cVar5 = '\x01';
  if (9 < num_threads) {
    sVar4 = num_threads;
    cVar3 = '\x04';
    do {
      cVar5 = cVar3;
      if (sVar4 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_00117200;
      }
      if (sVar4 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_00117200;
      }
      if (sVar4 < 10000) goto LAB_00117200;
      bVar2 = 99999 < sVar4;
      sVar4 = sVar4 / 10000;
      cVar3 = cVar5 + '\x04';
    } while (bVar2);
    cVar5 = cVar5 + '\x01';
  }
LAB_00117200:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_50,local_48,num_threads);
  __l._M_len = 4;
  __l._M_array = &local_b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_d0,__l,&local_d1);
  local_b8 = callbacks;
  detail::
  make_unique<CivetServer,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,CivetCallbacks_const*&>
            ((detail *)this,&local_d0,&local_b8);
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->endpoints_).
  super__Vector_base<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>,_std::allocator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  (this->endpoints_).
  super__Vector_base<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>,_std::allocator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->endpoints_).
  super__Vector_base<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>,_std::allocator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d0);
  lVar6 = 0;
  do {
    if (local_40 + lVar6 != *(char **)((long)&local_50 + lVar6)) {
      operator_delete(*(char **)((long)&local_50 + lVar6));
    }
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x80);
  return;
}

Assistant:

Exposer::Exposer(const std::string& bind_address, const std::size_t num_threads,
                 const CivetCallbacks* callbacks)
    : Exposer(
          std::vector<std::string>{"listening_ports", bind_address,
                                   "num_threads", std::to_string(num_threads)},
          callbacks) {}